

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Ceil::~Ceil(Ceil *this)

{
  Ceil *this_local;
  
  ~Ceil(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Ceil (void) : PreciseFunc1("ceil", deCeil) {}